

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
* __thiscall
imrt::ApertureILS::getShuffledApertureNeighbors
          (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,ApertureILS *this,Plan *P)

{
  pointer *pppVar1;
  pointer ppVar2;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  pair<int,_int> pVar7;
  pair<int,_int> pVar8;
  ulong uVar9;
  pointer ppVar10;
  iterator iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  _List_node_base *p_Var15;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_68;
  pair<int,_int> local_58;
  ulong local_50;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_48;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  p_Var15 = (_List_node_base *)&local_48;
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)p_Var15,__x);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
      _M_size != 0) {
    local_50 = 0;
    uVar9 = local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
            _M_node._M_size;
    do {
      p_Var15 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)&p_Var15->_M_next
                 )->_M_impl)._M_node.super__List_node_base._M_next;
      lVar13 = (long)p_Var15[1]._M_next;
      if (0 < *(int *)(lVar13 + 0x40)) {
        lVar12 = 0;
        do {
          local_58 = (pair<int,_int>)(lVar12 << 0x20 | local_50);
          for (lVar14 = 0; iVar5 = Collimator::getXdim(*(Collimator **)(lVar13 + 0xb0)),
              lVar14 < iVar5; lVar14 = lVar14 + 1) {
            iVar5 = (int)lVar12;
            pVar7 = Station::getApertureShape((Station *)p_Var15[1]._M_next,iVar5,(int)lVar14);
            pVar8 = Collimator::getActiveRange
                              (*(Collimator **)((long)p_Var15[1]._M_next + 0xb0),(int)lVar14,
                               *(int *)((long)p_Var15[1]._M_next + 8));
            if (pVar8.first != -1) {
              uVar6 = Station::getBeamIndex
                                ((Station *)p_Var15[1]._M_next,
                                 (pair<int,_int>)(((long)pVar7 << 0x20) + lVar14));
              bVar4 = Station::isOpenBeamlet((Station *)p_Var15[1]._M_next,uVar6,iVar5);
              if (bVar4) {
                local_68.second = (pair<int,_int>)(((ulong)uVar6 << 0x20) + 0xffffffff);
                local_68.first = local_58;
                iVar11._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar11._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                  ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                            ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                              *)__return_storage_ptr__,iVar11,&local_68);
                }
                else {
LAB_0012a3dd:
                  local_68.first = local_58;
                  (iVar11._M_current)->first = local_58;
                  (iVar11._M_current)->second = local_68.second;
                  pppVar1 = &(__return_storage_ptr__->
                             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *pppVar1 = *pppVar1 + 1;
                }
              }
              else {
                local_68.second = (pair<int,_int>)((ulong)uVar6 << 0x20 | 1);
                local_68.first = local_58;
                iVar11._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar11._M_current !=
                    (__return_storage_ptr__->
                    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0012a3dd;
                std::
                vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                          ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                            *)__return_storage_ptr__,iVar11,&local_68);
              }
              uVar6 = Station::getBeamIndex
                                ((Station *)p_Var15[1]._M_next,
                                 (pair<int,_int>)(((ulong)pVar7 & 0xffffffff00000000) + lVar14));
              bVar4 = Station::isOpenBeamlet((Station *)p_Var15[1]._M_next,uVar6,iVar5);
              if (bVar4) {
                local_68.second = (pair<int,_int>)((ulong)uVar6 << 0x20 | 0xfffffffe);
                local_68.first = local_58;
                iVar11._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar11._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                  ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                            ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                              *)__return_storage_ptr__,iVar11,&local_68);
                }
                else {
LAB_0012a473:
                  local_68.first = local_58;
                  (iVar11._M_current)->first = local_58;
                  (iVar11._M_current)->second = local_68.second;
                  pppVar1 = &(__return_storage_ptr__->
                             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *pppVar1 = *pppVar1 + 1;
                }
              }
              else {
                local_68.second = (pair<int,_int>)((ulong)uVar6 << 0x20 | 1);
                local_68.first = local_58;
                iVar11._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar11._M_current !=
                    (__return_storage_ptr__->
                    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0012a473;
                std::
                vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                          ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                            *)__return_storage_ptr__,iVar11,&local_68);
              }
            }
            lVar13 = (long)p_Var15[1]._M_next;
          }
          lVar12 = lVar12 + 1;
          lVar13 = (long)p_Var15[1]._M_next;
          uVar9 = local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                  _M_impl._M_node._M_size;
        } while (lVar12 < *(int *)(lVar13 + 0x40));
      }
      local_50 = local_50 + 1;
    } while (local_50 < uVar9);
    ppVar2 = (__return_storage_ptr__->
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (__return_storage_ptr__->
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ppVar2 != ppVar3) && (ppVar2 + 1 != ppVar3)) {
      lVar13 = 0x10;
      do {
        iVar5 = rand();
        lVar12 = (long)iVar5 % ((lVar13 >> 4) + 1);
        if (lVar13 != lVar12 * 0x10) {
          ppVar10 = ppVar2 + lVar12;
          iVar5 = *(int *)((long)&(ppVar2->first).first + lVar13);
          *(int *)((long)&(ppVar2->first).first + lVar13) = (ppVar10->first).first;
          (ppVar10->first).first = iVar5;
          iVar5 = *(int *)((long)&(ppVar2->first).second + lVar13);
          *(int *)((long)&(ppVar2->first).second + lVar13) = (ppVar10->first).second;
          (ppVar10->first).second = iVar5;
          iVar5 = *(int *)((long)&(ppVar2->second).first + lVar13);
          *(int *)((long)&(ppVar2->second).first + lVar13) = (ppVar10->second).first;
          (ppVar10->second).first = iVar5;
          iVar5 = *(int *)((long)&(ppVar2->second).second + lVar13);
          *(int *)((long)&(ppVar2->second).second + lVar13) = (ppVar10->second).second;
          (ppVar10->second).second = iVar5;
        }
        ppVar10 = (pointer)((long)&ppVar2[1].first.first + lVar13);
        lVar13 = lVar13 + 0x10;
      } while (ppVar10 != ppVar3);
    }
  }
  while (local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    p_Var15 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next);
    local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var15;
  }
  return __return_storage_ptr__;
}

Assistant:

vector < pair<pair<int, int>, pair<int, int>> > ApertureILS::getShuffledApertureNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  vector<pair< pair<int,int> , pair<int, int> >> a_list;
  list<Station*>::iterator st;
  int beamlet;
  st = stations.begin();

  pair <int,int> pattern;
  pair <int,int> active;
  
  for (int s = 0; s < stations.size(); s++) {
    for (int a = 0; a < (*st)->getNbApertures(); a++){
      for (int k = 0; k< (*st)->collimator.getXdim() ; k++){
        //One pair -k (-row) for closing aperture
        //One pair (k) (row) for opening aperture
        pattern = (*st)->getApertureShape(a, k);
        active = (*st)->collimator.getActiveRange(k, (*st)->getAngle());
        if (active.first == -1) continue;
        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.first));
        if((*st)->isOpenBeamlet(beamlet, a))
           a_list.push_back(make_pair(make_pair(s,a) , make_pair(-1,beamlet)));
        else 
            a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));

        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.second));
        if((*st)->isOpenBeamlet(beamlet, a))
           a_list.push_back(make_pair(make_pair(s,a) , make_pair(-2,beamlet)));
        else 
           a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
      }
    }
    std::advance(st,1);
  }
  std::random_shuffle(a_list.begin(), a_list.end());
  return(a_list);
}